

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::ContentEncoding::Write(ContentEncoding *this,IMkvWriter *writer)

{
  bool bVar1;
  ContentEncAESSettings *this_00;
  uint64 uVar2;
  IMkvWriter *writer_00;
  long lVar3;
  long *in_RSI;
  uint8 *in_RDI;
  int64_t stop_position;
  int64_t payload_position;
  uint64_t size;
  uint64_t encoding_size;
  uint64_t encryption_size;
  IMkvWriter *in_stack_ffffffffffffffc0;
  uint64_t in_stack_ffffffffffffffc8;
  ContentEncoding *in_stack_ffffffffffffffd0;
  IMkvWriter *writer_01;
  ContentEncoding *in_stack_ffffffffffffffd8;
  bool local_1;
  
  EncryptionSize(in_stack_ffffffffffffffd0);
  this_00 = (ContentEncAESSettings *)
            EncodingSize(in_stack_ffffffffffffffd8,(uint64_t)in_stack_ffffffffffffffd0,
                         in_stack_ffffffffffffffc8);
  uVar2 = EbmlMasterElementSize((uint64)in_stack_ffffffffffffffc0,(uint64)in_RDI);
  writer_01 = (IMkvWriter *)((long)&this_00->cipher_mode_ + uVar2);
  writer_00 = (IMkvWriter *)(**(code **)(*in_RSI + 8))();
  if ((long)writer_00 < 0) {
    local_1 = false;
  }
  else {
    bVar1 = WriteEbmlMasterElement(writer_00,(uint64)in_stack_ffffffffffffffc0,(uint64)in_RDI);
    if (bVar1) {
      bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc0,(uint64)in_RDI,0x17136c);
      if (bVar1) {
        bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc0,(uint64)in_RDI,0x171391);
        if (bVar1) {
          bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc0,(uint64)in_RDI,0x1713b6);
          if (bVar1) {
            bVar1 = WriteEbmlMasterElement
                              (writer_00,(uint64)in_stack_ffffffffffffffc0,(uint64)in_RDI);
            if (bVar1) {
              bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc0,(uint64)in_RDI,0x1713fc);
              if (bVar1) {
                bVar1 = WriteEbmlElement(writer_00,(uint64)in_stack_ffffffffffffffc0,in_RDI,0x171422
                                        );
                if (bVar1) {
                  bVar1 = ContentEncAESSettings::Write(this_00,writer_01);
                  if (bVar1) {
                    lVar3 = (**(code **)(*in_RSI + 8))();
                    if ((lVar3 < 0) || ((IMkvWriter *)(lVar3 - (long)writer_00) != writer_01)) {
                      local_1 = false;
                    }
                    else {
                      local_1 = true;
                    }
                  }
                  else {
                    local_1 = false;
                  }
                }
                else {
                  local_1 = false;
                }
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool ContentEncoding::Write(IMkvWriter* writer) const {
  const uint64_t encryption_size = EncryptionSize();
  const uint64_t encoding_size = EncodingSize(0, encryption_size);
  const uint64_t size =
      EbmlMasterElementSize(libwebm::kMkvContentEncoding, encoding_size) +
      encoding_size;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvContentEncoding,
                              encoding_size))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncodingOrder,
                        static_cast<uint64>(encoding_order_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncodingScope,
                        static_cast<uint64>(encoding_scope_)))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncodingType,
                        static_cast<uint64>(encoding_type_)))
    return false;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvContentEncryption,
                              encryption_size))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncAlgo,
                        static_cast<uint64>(enc_algo_))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvContentEncKeyID, enc_key_id_,
                        enc_key_id_length_))
    return false;

  if (!enc_aes_settings_.Write(writer))
    return false;

  const int64_t stop_position = writer->Position();
  if (stop_position < 0 ||
      stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  return true;
}